

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream
          (cmGeneratedFileStream *this,string *name,bool quiet,Encoding encoding)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  codecvt *this_00;
  locale local_68;
  locale local_60;
  locale local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Encoding local_20;
  byte local_19;
  Encoding encoding_local;
  bool quiet_local;
  string *name_local;
  cmGeneratedFileStream *this_local;
  
  local_20 = encoding;
  local_19 = quiet;
  _encoding_local = name;
  name_local = (string *)this;
  std::ios::ios((ios *)&(this->super_ofstream).field_0x140);
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             _encoding_local);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_00b88450;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_00b88478;
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(this,(char *)&PTR_construction_vtable_24__00b88490,_Var2);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_00b88450;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_00b88478;
  bVar1 = std::ios::operator!((ios *)((long)&(this->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if (((bVar1 & 1) != 0) && ((local_19 & 1) == 0)) {
    std::operator+(&local_50,"Cannot open file for write: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_ofstream).field_0x118);
    cmSystemTools::Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmSystemTools::ReportLastSystemError("");
  }
  if (local_20 != None) {
    std::ios_base::getloc((ios_base *)&local_68);
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,local_20);
    std::locale::locale<codecvt>(&local_60,&local_68,this_00);
    std::ios::imbue(&local_58);
    std::locale::~locale(&local_58);
    std::locale::~locale(&local_60);
    std::locale::~locale(&local_68);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(std::string const& name,
                                             bool quiet, Encoding encoding)
  : cmGeneratedFileStreamBase(name)
  , Stream(TempName.c_str())
{
  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: " + this->TempName);
    cmSystemTools::ReportLastSystemError("");
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (encoding != codecvt::None) {
    imbue(std::locale(getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
}